

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::SerializedModel::ByteSizeLong(SerializedModel *this)

{
  string *psVar1;
  size_t sVar2;
  size_t sVar3;
  
  psVar1 = (this->identifier_).ptr_;
  if (psVar1->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar2 = sVar2 + 1;
  }
  psVar1 = (this->model_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::BytesSize(psVar1);
    sVar2 = sVar2 + sVar3 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t SerializedModel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SerializedModel)
  size_t total_size = 0;

  // string identifier = 1;
  if (this->identifier().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->identifier());
  }

  // bytes model = 2;
  if (this->model().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->model());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}